

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

size_t __thiscall
jrtplib::RTCPCompoundPacketBuilder::SDESSource::NeededBytesWithExtraItem
          (SDESSource *this,uint8_t itemdatalength)

{
  size_t r;
  size_t x;
  uint8_t itemdatalength_local;
  SDESSource *this_local;
  
  r = this->totalitemsize + (ulong)itemdatalength + 3;
  if ((r & 3) != 0) {
    r = (4 - (r & 3)) + r;
  }
  return r + 4;
}

Assistant:

size_t NeededBytesWithExtraItem(uint8_t itemdatalength)
		{
			size_t x,r;
			x = totalitemsize + sizeof(RTCPSDESHeader) + (size_t)itemdatalength + 1;
			r = x%sizeof(uint32_t);
			if (r != 0)
				x += (sizeof(uint32_t)-r); // make sure it ends on a 32 bit boundary
			x += sizeof(uint32_t); // for ssrc
			return x;
		}